

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SockAddr.cpp
# Opt level: O0

ags_t AGSSock::SockAddr_get_Port(SockAddr *sa)

{
  uint16_t uVar1;
  sockaddr_in6 *addr_1;
  sockaddr_in *addr;
  SockAddr *sa_local;
  
  if ((sa->super_sockaddr_storage).ss_family == 2) {
    uVar1 = ntohs(*(uint16_t *)(sa->super_sockaddr_storage).__ss_padding);
    sa_local = (SockAddr *)(ulong)uVar1;
  }
  else if ((sa->super_sockaddr_storage).ss_family == 10) {
    uVar1 = ntohs(*(uint16_t *)(sa->super_sockaddr_storage).__ss_padding);
    sa_local = (SockAddr *)(ulong)uVar1;
  }
  else {
    sa_local = (SockAddr *)0x0;
  }
  return (ags_t)sa_local;
}

Assistant:

ags_t SockAddr_get_Port(SockAddr *sa)
{
	if (sa->ss_family == AF_INET)
	{
		sockaddr_in *addr = reinterpret_cast<sockaddr_in *> (sa);
		return ntohs(addr->sin_port);
	}
	else if (sa->ss_family == AF_INET6)
	{
		sockaddr_in6 *addr = reinterpret_cast<sockaddr_in6 *> (sa);
		return ntohs(addr->sin6_port);
	}
	else
		return 0;
}